

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::WriteNinjaFilesInclusionCommon(cmLocalNinjaGenerator *this,ostream *os)

{
  cmGlobalNinjaGenerator *this_00;
  string rulesFilePath;
  string ninjaRulesFile;
  string local_78;
  string local_58;
  string local_38;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Include auxiliary files.\n\n",0x1c);
  this_00 = (cmGlobalNinjaGenerator *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,cmGlobalNinjaGenerator::NINJA_RULES_FILE,
             (allocator<char> *)&local_58);
  cmGlobalNinjaGenerator::NinjaOutputPath(&local_38,this_00,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  cmGlobalNinjaGenerator::EncodePath(&local_78,this_00,&local_38);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Include rules file.","");
  cmGlobalNinjaGenerator::WriteInclude(os,&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaFilesInclusionCommon(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Include auxiliary files.\n\n";
  cmGlobalNinjaGenerator* ng = this->GetGlobalNinjaGenerator();
  std::string const ninjaRulesFile =
    ng->NinjaOutputPath(cmGlobalNinjaGenerator::NINJA_RULES_FILE);
  std::string const rulesFilePath = ng->EncodePath(ninjaRulesFile);
  cmGlobalNinjaGenerator::WriteInclude(os, rulesFilePath,
                                       "Include rules file.");
  os << "\n";
}